

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_sink.h
# Opt level: O3

void __thiscall
spdlog::sinks::udp_sink<std::mutex>::sink_it_(udp_sink<std::mutex> *this,log_msg *msg)

{
  formatter *pfVar1;
  size_t in_RCX;
  int in_R8D;
  memory_buf_t formatted;
  undefined **local_130;
  undefined1 *local_128;
  void *local_120;
  undefined8 local_118;
  undefined1 local_110 [256];
  
  local_120 = (void *)0x0;
  local_130 = &PTR_grow_00159480;
  local_118 = 0xfa;
  pfVar1 = (this->super_base_sink<std::mutex>).formatter_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_128 = local_110;
  (*pfVar1->_vptr_formatter[2])(pfVar1,msg,&local_130);
  details::udp_client::send(&this->client_,(int)local_128,local_120,in_RCX,in_R8D);
  if (local_128 != local_110) {
    operator_delete(local_128);
  }
  return;
}

Assistant:

void sink_it_(const spdlog::details::log_msg &msg) override
    {
        spdlog::memory_buf_t formatted;
        spdlog::sinks::base_sink<Mutex>::formatter_->format(msg, formatted);
        client_.send(formatted.data(), formatted.size());
    }